

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

w_status w_logger_register(w_logger *logger_handle,w_stream stream,w_log_lvl lvl,w_log_fmt fmt)

{
  int iVar1;
  ulong uVar2;
  wp_log_logger *logger;
  uint16_t i;
  w_status status;
  w_log_fmt fmt_local;
  w_log_lvl lvl_local;
  w_stream stream_local;
  w_logger *logger_handle_local;
  
  if (logger_handle == (w_logger *)0x0) {
    w_handle_failed_assertion
              ("logger_handle != NULL","w_logger_register",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x158);
  }
  if (W_LOG_LVL_ALL < lvl) {
    w_handle_failed_assertion
              ("lvl >= 0 && lvl < WP_LOG_LVL_END","w_logger_register",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x159);
  }
  if (W_LOG_FMT_PLAIN_STYLIZED < fmt) {
    w_handle_failed_assertion
              ("fmt >= 0 && fmt < WP_LOG_FMT_END","w_logger_register",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x15a);
  }
  iVar1 = w_mtx_lock(&wp_log_mtx);
  if (iVar1 == 0) {
    for (logger._2_2_ = 0; logger._2_2_ < 8; logger._2_2_ = logger._2_2_ + 1) {
      uVar2 = (ulong)logger._2_2_;
      if ((wp_log_logger_pool[uVar2].valid == 0) && (wp_log_logger_pool[uVar2].id != 0xffff)) {
        wp_log_logger_pool[uVar2].id = wp_log_logger_pool[uVar2].id + 1;
        wp_log_logger_pool[uVar2].stream = stream;
        wp_log_logger_pool[uVar2].lvl = lvl;
        wp_log_logger_pool[uVar2].fmt = fmt;
        wp_log_logger_pool[uVar2].valid = 1;
        logger_handle->handle = CONCAT22(wp_log_logger_pool[uVar2].id,logger._2_2_);
        logger._4_4_ = W_SUCCESS;
        goto LAB_0010787d;
      }
    }
    logger._4_4_ = W_ERROR_BUF_FULL;
LAB_0010787d:
    iVar1 = w_mtx_unlock(&wp_log_mtx);
    if (iVar1 != 0) {
      logger._4_4_ = W_ERROR_UNLOCK_FAILED;
    }
    logger_handle_local._4_4_ = logger._4_4_;
  }
  else {
    logger_handle_local._4_4_ = W_ERROR_LOCK_FAILED;
  }
  return logger_handle_local._4_4_;
}

Assistant:

enum w_status
w_logger_register(
    struct w_logger *logger_handle,
    w_stream stream,
    enum w_log_lvl lvl,
    enum w_log_fmt fmt
)
{
    enum w_status status;
    uint16_t i;

    W_ASSERT(logger_handle != NULL);
    W_ASSERT(lvl >= 0 && lvl < WP_LOG_LVL_END);
    W_ASSERT(fmt >= 0 && fmt < WP_LOG_FMT_END);

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        struct wp_log_logger *logger;

        logger = &wp_log_logger_pool[i];

        // Find the first slot available with no valid logger assigned to it.
        if (
            !logger->valid
            && !W_UINT_IS_ADD_WRAPPING(UINT16_MAX, logger->id, 1)
        )
        {
            logger->id += 1;
            logger->stream = stream;
            logger->lvl = lvl;
            logger->fmt = fmt;
            logger->valid = 1;

            logger_handle->handle = WP_LOG_SET_HANDLE(i, logger->id);
            status = W_SUCCESS;
            goto exit;
        }
    }

    status = W_ERROR_BUF_FULL;

exit:
    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}